

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64BaseInfo.c
# Opt level: O0

char * A64NamedImmMapper_toString(A64NamedImmMapper *N,uint32_t Value,_Bool *Valid)

{
  uint i;
  _Bool *Valid_local;
  uint32_t Value_local;
  A64NamedImmMapper *N_local;
  
  i = 0;
  while( true ) {
    if (N->NumPairs <= (ulong)i) {
      *Valid = false;
      return (char *)0x0;
    }
    if (N->Pairs[i].Value == Value) break;
    i = i + 1;
  }
  *Valid = true;
  return N->Pairs[i].Name;
}

Assistant:

const char *A64NamedImmMapper_toString(const A64NamedImmMapper *N, uint32_t Value, bool *Valid)
{
	unsigned i;
	for (i = 0; i < N->NumPairs; ++i) {
		if (N->Pairs[i].Value == Value) {
			*Valid = true;
			return N->Pairs[i].Name;
		}
	}

	*Valid = false;
	return 0;
}